

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O0

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long *in_RSI;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  __m128 _p;
  __m128 _zero;
  __m128 _one;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_828;
  undefined8 uStack_820;
  int local_7f8;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined4 local_7d0;
  long local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined8 local_7a8;
  undefined1 (*local_7a0) [16];
  int local_794;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  long *local_770;
  undefined1 local_75d;
  int local_75c;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_738;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined4 local_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined1 (*local_6f0) [16];
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined1 (*local_580) [16];
  long local_578;
  undefined4 local_56c;
  long local_568;
  undefined1 (*local_560) [16];
  undefined4 local_554;
  int local_550;
  int local_54c;
  undefined8 *local_548;
  undefined4 local_53c;
  long local_538;
  undefined8 *local_518;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_77c = *(int *)((long)in_RSI + 0x2c);
  local_780 = (int)in_RSI[6];
  local_784 = *(int *)((long)in_RSI + 0x34);
  local_788 = (int)in_RSI[7];
  local_78c = (int)in_RSI[3];
  local_790 = local_77c * local_780 * local_784 * local_78c;
  local_770 = in_RSI;
  for (local_794 = 0; local_794 < local_788; local_794 = local_794 + 1) {
    local_750 = &local_7e8;
    local_54c = *(int *)((long)local_770 + 0x2c);
    local_550 = (int)local_770[6];
    local_554 = *(undefined4 *)((long)local_770 + 0x34);
    local_560 = (undefined1 (*) [16])(*local_770 + local_770[8] * (long)local_794 * local_770[2]);
    local_568 = local_770[2];
    local_56c = (undefined4)local_770[3];
    local_578 = local_770[4];
    local_548 = &local_7e8;
    local_538 = (long)local_54c * (long)local_550 * local_568;
    local_748 = &local_7e8;
    local_738 = &local_7e8;
    local_53c = 0x10;
    local_75c = local_794;
    local_75d = 1;
    local_7e8 = 0;
    local_7d8 = 0;
    local_7d0 = 0;
    local_7c0 = 0;
    local_7bc = 0;
    local_7b8 = 0;
    local_7b4 = 0;
    local_7b0 = 0;
    local_7a8 = 0;
    local_7e0 = 0;
    local_70c = 0x3f800000;
    local_728 = 0x3f800000;
    uStack_724 = 0x3f800000;
    uStack_720 = 0x3f800000;
    uStack_71c = 0x3f800000;
    local_708 = 0;
    uStack_700 = 0;
    local_7a0 = local_560;
    for (local_7f8 = 0; local_518 = local_738, local_7c8 = local_578, local_7f8 + 3 < local_790;
        local_7f8 = local_7f8 + 4) {
      local_6f0 = local_7a0;
      local_6d8 = *(undefined8 *)*local_7a0;
      uStack_6d0 = *(undefined8 *)(*local_7a0 + 8);
      local_5a8 = 0;
      uStack_5a0 = 0;
      local_5b8._0_4_ = (float)local_6d8;
      local_5b8._4_4_ = (float)((ulong)local_6d8 >> 0x20);
      uStack_5b0._0_4_ = (float)uStack_6d0;
      uStack_5b0._4_4_ = (float)((ulong)uStack_6d0 >> 0x20);
      local_638 = CONCAT44(0.0 - local_5b8._4_4_,0.0 - (float)local_5b8);
      uStack_630._0_4_ = 0.0 - (float)uStack_5b0;
      uStack_630._4_4_ = 0.0 - uStack_5b0._4_4_;
      local_628 = 0;
      uStack_620 = 0;
      local_678 = 0x3f8000003f800000;
      uStack_670 = 0x3f8000003f800000;
      local_4d8 = local_638;
      uStack_4d0 = uStack_630;
      local_4e8 = 0x42b0c0a542b0c0a5;
      uStack_4e0 = 0x42b0c0a542b0c0a5;
      auVar4._8_8_ = uStack_630;
      auVar4._0_8_ = local_638;
      auVar3._8_8_ = 0x42b0c0a542b0c0a5;
      auVar3._0_8_ = 0x42b0c0a542b0c0a5;
      auVar8 = minps(auVar4,auVar3);
      local_638 = auVar8._0_8_;
      local_4b8 = local_638;
      uStack_630 = auVar8._8_8_;
      uStack_4b0 = uStack_630;
      local_4c8 = 0xc2b0c0a5c2b0c0a5;
      uStack_4c0 = 0xc2b0c0a5c2b0c0a5;
      auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar8 = maxps(auVar8,auVar5);
      local_638 = auVar8._0_8_;
      uVar1 = local_638;
      uStack_630 = auVar8._8_8_;
      uVar2 = uStack_630;
      local_468 = 0x3fb8aa3b3fb8aa3b;
      uStack_460 = 0x3fb8aa3b3fb8aa3b;
      local_458._0_4_ = auVar8._0_4_;
      local_458._4_4_ = auVar8._4_4_;
      uStack_450._0_4_ = auVar8._8_4_;
      uStack_450._4_4_ = auVar8._12_4_;
      local_5e8 = CONCAT44(local_458._4_4_ * 1.442695,(float)local_458 * 1.442695);
      uStack_5e0 = CONCAT44(uStack_450._4_4_ * 1.442695,(float)uStack_450 * 1.442695);
      local_5f8 = 0x3f0000003f000000;
      uStack_5f0 = 0x3f0000003f000000;
      fVar9 = (float)local_458 * 1.442695 + 0.5;
      fVar10 = local_458._4_4_ * 1.442695 + 0.5;
      fVar11 = (float)uStack_450 * 1.442695 + 0.5;
      fVar12 = uStack_450._4_4_ * 1.442695 + 0.5;
      local_438 = CONCAT44(fVar10,fVar9);
      uStack_430 = CONCAT44(fVar12,fVar11);
      local_428 = CONCAT44((int)fVar10,(int)fVar9);
      uStack_420 = CONCAT44((int)fVar12,(int)fVar11);
      local_658 = (float)(int)fVar9;
      fStack_654 = (float)(int)fVar10;
      fStack_650 = (float)(int)fVar11;
      fStack_64c = (float)(int)fVar12;
      local_648 = CONCAT44(fStack_654,local_658);
      uStack_640 = CONCAT44(fStack_64c,fStack_650);
      local_408 = local_648;
      uStack_400 = uStack_640;
      local_418 = CONCAT44(fVar10,fVar9);
      uStack_410 = CONCAT44(fVar12,fVar11);
      local_688 = CONCAT44(-(uint)(fVar10 < fStack_654),-(uint)(fVar9 < local_658));
      uStack_680 = CONCAT44(-(uint)(fVar12 < fStack_64c),-(uint)(fVar11 < fStack_650));
      local_3e8 = local_688;
      uStack_3e0 = uStack_680;
      local_3f8 = 0x3f8000003f800000;
      uStack_3f0 = 0x3f8000003f800000;
      local_688 = local_688 & 0x3f8000003f800000;
      uStack_680 = uStack_680 & 0x3f8000003f800000;
      local_5c8 = local_648;
      uStack_5c0 = uStack_640;
      local_5d8._0_4_ = (float)local_688;
      local_5d8._4_4_ = (float)(local_688 >> 0x20);
      uStack_5d0._0_4_ = (float)uStack_680;
      uStack_5d0._4_4_ = (float)(uStack_680 >> 0x20);
      local_658 = local_658 - (float)local_5d8;
      fStack_654 = fStack_654 - local_5d8._4_4_;
      fStack_650 = fStack_650 - (float)uStack_5d0;
      fStack_64c = fStack_64c - uStack_5d0._4_4_;
      local_348 = CONCAT44(fStack_654,local_658);
      uStack_340 = CONCAT44(fStack_64c,fStack_650);
      local_368 = local_638;
      uStack_360 = uStack_630;
      local_358 = 0x3f3180003f318000;
      uStack_350 = 0x3f3180003f318000;
      local_328 = local_638;
      uStack_320 = uStack_630;
      local_318 = 0x3f3180003f318000;
      uStack_310 = 0x3f3180003f318000;
      local_338 = local_658 * 0.6933594;
      fStack_334 = fStack_654 * 0.6933594;
      fStack_330 = fStack_650 * 0.6933594;
      fStack_32c = fStack_64c * 0.6933594;
      local_638 = CONCAT44(local_458._4_4_ - fStack_334,(float)local_458 - local_338);
      uStack_630._0_4_ = (float)uStack_450 - fStack_330;
      uStack_630._4_4_ = uStack_450._4_4_ - fStack_32c;
      local_3b8 = CONCAT44(fStack_654,local_658);
      uStack_3b0 = CONCAT44(fStack_64c,fStack_650);
      local_3d8 = local_638;
      uStack_3d0 = uStack_630;
      local_3c8 = 0xb95e8083b95e8083;
      uStack_3c0 = 0xb95e8083b95e8083;
      local_398 = local_638;
      uStack_390 = uStack_630;
      local_388 = 0xb95e8083b95e8083;
      uStack_380 = 0xb95e8083b95e8083;
      local_3a8 = local_658 * -0.00021219444;
      fStack_3a4 = fStack_654 * -0.00021219444;
      fStack_3a0 = fStack_650 * -0.00021219444;
      fStack_39c = fStack_64c * -0.00021219444;
      fVar9 = ((float)local_458 - local_338) - local_3a8;
      fVar10 = (local_458._4_4_ - fStack_334) - fStack_3a4;
      fVar11 = ((float)uStack_450 - fStack_330) - fStack_3a0;
      fVar12 = (uStack_450._4_4_ - fStack_32c) - fStack_39c;
      local_638 = CONCAT44(fVar10,fVar9);
      uStack_630._0_4_ = fVar11;
      uStack_630._4_4_ = fVar12;
      local_488 = local_638;
      uStack_480 = uStack_630;
      local_648 = CONCAT44(fVar10 * fVar10,fVar9 * fVar9);
      uStack_640 = CONCAT44(fVar12 * fVar12,fVar11 * fVar11);
      local_a8 = 0x3950696739506967;
      uStack_a0 = 0x3950696739506967;
      local_b8 = local_638;
      uStack_b0 = uStack_630;
      local_c8 = 0x3ab743ce3ab743ce;
      uStack_c0 = 0x3ab743ce3ab743ce;
      local_68 = 0x3950696739506967;
      uStack_60 = 0x3950696739506967;
      local_78 = local_638;
      uStack_70 = uStack_630;
      local_88 = fVar9 * 0.00019875691;
      fStack_84 = fVar10 * 0.00019875691;
      fStack_80 = fVar11 * 0.00019875691;
      fStack_7c = fVar12 * 0.00019875691;
      local_98 = 0x3ab743ce3ab743ce;
      uStack_90 = 0x3ab743ce3ab743ce;
      local_698 = CONCAT44(fStack_84 + 0.0013981999,local_88 + 0.0013981999);
      uStack_690 = CONCAT44(fStack_7c + 0.0013981999,fStack_80 + 0.0013981999);
      local_118 = local_698;
      uStack_110 = uStack_690;
      local_128 = local_638;
      uStack_120 = uStack_630;
      local_138 = 0x3c0889083c088908;
      uStack_130 = 0x3c0889083c088908;
      local_d8 = local_698;
      uStack_d0 = uStack_690;
      local_e8 = local_638;
      uStack_e0 = uStack_630;
      local_f8 = (local_88 + 0.0013981999) * fVar9;
      fStack_f4 = (fStack_84 + 0.0013981999) * fVar10;
      fStack_f0 = (fStack_80 + 0.0013981999) * fVar11;
      fStack_ec = (fStack_7c + 0.0013981999) * fVar12;
      local_108 = 0x3c0889083c088908;
      uStack_100 = 0x3c0889083c088908;
      local_698 = CONCAT44(fStack_f4 + 0.008333452,local_f8 + 0.008333452);
      uStack_690 = CONCAT44(fStack_ec + 0.008333452,fStack_f0 + 0.008333452);
      local_188 = local_698;
      uStack_180 = uStack_690;
      local_198 = local_638;
      uStack_190 = uStack_630;
      local_1a8 = 0x3d2aa9c13d2aa9c1;
      uStack_1a0 = 0x3d2aa9c13d2aa9c1;
      local_148 = local_698;
      uStack_140 = uStack_690;
      local_158 = local_638;
      uStack_150 = uStack_630;
      local_168 = (local_f8 + 0.008333452) * fVar9;
      fStack_164 = (fStack_f4 + 0.008333452) * fVar10;
      fStack_160 = (fStack_f0 + 0.008333452) * fVar11;
      fStack_15c = (fStack_ec + 0.008333452) * fVar12;
      local_178 = 0x3d2aa9c13d2aa9c1;
      uStack_170 = 0x3d2aa9c13d2aa9c1;
      local_698 = CONCAT44(fStack_164 + 0.041665796,local_168 + 0.041665796);
      uStack_690 = CONCAT44(fStack_15c + 0.041665796,fStack_160 + 0.041665796);
      local_1f8 = local_698;
      uStack_1f0 = uStack_690;
      local_208 = local_638;
      uStack_200 = uStack_630;
      local_218 = 0x3e2aaaaa3e2aaaaa;
      uStack_210 = 0x3e2aaaaa3e2aaaaa;
      local_1b8 = local_698;
      uStack_1b0 = uStack_690;
      local_1c8 = local_638;
      uStack_1c0 = uStack_630;
      local_1d8 = (local_168 + 0.041665796) * fVar9;
      fStack_1d4 = (fStack_164 + 0.041665796) * fVar10;
      fStack_1d0 = (fStack_160 + 0.041665796) * fVar11;
      fStack_1cc = (fStack_15c + 0.041665796) * fVar12;
      local_1e8 = 0x3e2aaaaa3e2aaaaa;
      uStack_1e0 = 0x3e2aaaaa3e2aaaaa;
      local_698 = CONCAT44(fStack_1d4 + 0.16666666,local_1d8 + 0.16666666);
      uStack_690 = CONCAT44(fStack_1cc + 0.16666666,fStack_1d0 + 0.16666666);
      local_268 = local_698;
      uStack_260 = uStack_690;
      local_278 = local_638;
      uStack_270 = uStack_630;
      local_228 = local_698;
      uStack_220 = uStack_690;
      local_238 = local_638;
      uStack_230 = uStack_630;
      local_248 = (local_1d8 + 0.16666666) * fVar9;
      fStack_244 = (fStack_1d4 + 0.16666666) * fVar10;
      fStack_240 = (fStack_1d0 + 0.16666666) * fVar11;
      fStack_23c = (fStack_1cc + 0.16666666) * fVar12;
      local_258 = 0x3f0000003f000000;
      uStack_250 = 0x3f0000003f000000;
      local_698 = CONCAT44(fStack_244 + 0.5,local_248 + 0.5);
      uStack_690 = CONCAT44(fStack_23c + 0.5,fStack_240 + 0.5);
      local_2d8 = local_698;
      uStack_2d0 = uStack_690;
      local_2e8 = local_648;
      uStack_2e0 = uStack_640;
      local_2f8 = local_638;
      uStack_2f0 = uStack_630;
      local_298 = local_698;
      uStack_290 = uStack_690;
      local_2a8 = local_648;
      uStack_2a0 = uStack_640;
      local_2b8 = (local_248 + 0.5) * fVar9 * fVar9;
      fStack_2b4 = (fStack_244 + 0.5) * fVar10 * fVar10;
      fStack_2b0 = (fStack_240 + 0.5) * fVar11 * fVar11;
      fStack_2ac = (fStack_23c + 0.5) * fVar12 * fVar12;
      local_2c8 = local_638;
      uStack_2c0 = uStack_630;
      local_698 = CONCAT44(fStack_2b4 + fVar10,local_2b8 + fVar9);
      uStack_690 = CONCAT44(fStack_2ac + fVar12,fStack_2b0 + fVar11);
      local_608 = local_698;
      uStack_600 = uStack_690;
      local_618 = 0x3f8000003f800000;
      uStack_610 = 0x3f8000003f800000;
      local_6e8 = local_2b8 + fVar9 + 1.0;
      fStack_6e4 = fStack_2b4 + fVar10 + 1.0;
      fStack_6e0 = fStack_2b0 + fVar11 + 1.0;
      fStack_6dc = fStack_2ac + fVar12 + 1.0;
      local_698 = CONCAT44(fStack_6e4,local_6e8);
      uStack_690 = CONCAT44(fStack_6dc,fStack_6e0);
      local_448 = CONCAT44(fStack_654,local_658);
      uStack_440 = CONCAT44(fStack_64c,fStack_650);
      local_48 = CONCAT44((int)fStack_654,(int)local_658);
      uStack_40 = CONCAT44((int)fStack_64c,(int)fStack_650);
      local_58 = 0x7f0000007f;
      uStack_50 = 0x7f0000007f;
      iVar6 = (int)local_658 + 0x7f;
      fStack_664 = (float)((int)fStack_654 + 0x7f);
      fStack_660 = (float)((int)fStack_650 + 0x7f);
      fStack_65c = (float)((int)fStack_64c + 0x7f);
      local_28 = CONCAT44(fStack_664,iVar6);
      uStack_20 = CONCAT44(fStack_65c,fStack_660);
      local_2c = 0x17;
      local_668 = (float)(iVar6 * 0x800000);
      local_6a8 = CONCAT44(fStack_664,local_668);
      uStack_6a0 = CONCAT44(fStack_65c,fStack_660);
      local_498 = local_698;
      uStack_490 = uStack_690;
      local_6e8 = local_6e8 * local_668;
      fStack_6e4 = fStack_6e4 * fStack_664;
      fStack_6e0 = fStack_6e0 * fStack_660;
      fStack_6dc = fStack_6dc * fStack_65c;
      local_698 = CONCAT44(fStack_6e4,local_6e8);
      uStack_690 = CONCAT44(fStack_6dc,fStack_6e0);
      local_6c8 = local_698;
      uStack_6c0 = uStack_690;
      local_6e8 = local_6e8 + 1.0;
      fStack_6e4 = fStack_6e4 + 1.0;
      fStack_6e0 = fStack_6e0 + 1.0;
      fStack_6dc = fStack_6dc + 1.0;
      auVar8._4_4_ = fStack_6e4;
      auVar8._0_4_ = local_6e8;
      auVar8._8_4_ = fStack_6e0;
      auVar8._12_4_ = fStack_6dc;
      auVar8 = divps(*local_7a0,auVar8);
      local_580 = local_7a0;
      local_828 = auVar8._0_8_;
      local_598 = local_828;
      uStack_820 = auVar8._8_8_;
      uStack_590 = uStack_820;
      *(undefined8 *)*local_7a0 = local_828;
      *(undefined8 *)(*local_7a0 + 8) = uStack_820;
      local_7a0 = local_7a0 + 1;
      local_6b8 = 0x3f8000003f800000;
      uStack_6b0 = 0x3f8000003f800000;
      local_5d8 = local_688;
      uStack_5d0 = uStack_680;
      local_5b8 = local_6d8;
      uStack_5b0 = uStack_6d0;
      local_4a8 = local_6a8;
      uStack_4a0 = uStack_6a0;
      local_478 = local_488;
      uStack_470 = uStack_480;
      local_458 = uVar1;
      uStack_450 = uVar2;
      local_378 = local_3b8;
      uStack_370 = uStack_3b0;
      local_308 = local_348;
      uStack_300 = uStack_340;
      local_288 = local_5f8;
      uStack_280 = uStack_5f0;
      local_18 = local_6a8;
      uStack_10 = uStack_6a0;
    }
    for (; local_7f8 < local_790; local_7f8 = local_7f8 + 1) {
      fVar9 = *(float *)*local_7a0;
      dVar7 = std::exp((double)(ulong)(*(uint *)*local_7a0 ^ 0x80000000));
      *(float *)*local_7a0 = fVar9 / (SUB84(dVar7,0) + 1.0);
      local_7a0 = (undefined1 (*) [16])(*local_7a0 + 4);
    }
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}